

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O2

_Bool Curl_check_noproxy(char *name,char *no_proxy)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  size_t __n;
  ulong uVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  char cVar11;
  char *__src;
  uint uVar12;
  size_t sVar13;
  bool bVar14;
  bool bVar15;
  uint local_168 [4];
  uchar address_1 [16];
  size_t local_140;
  char checkip [128];
  char hostip [128];
  
  if (name == (char *)0x0) {
    return false;
  }
  if (no_proxy == (char *)0x0 || *name == '\0') {
    return false;
  }
  bVar1 = *no_proxy;
  if (bVar1 == 0) {
    return false;
  }
  if (bVar1 == 0x2a) {
    iVar6 = -(uint)(byte)no_proxy[1];
  }
  else {
    iVar6 = 0x2a - (uint)bVar1;
  }
  if (iVar6 == 0) {
    return true;
  }
  if (*name == '[') {
    pcVar4 = strchr(name,0x5d);
    if (pcVar4 == (char *)0x0) {
      return false;
    }
    __src = name + 1;
    local_140 = (long)pcVar4 - (long)__src;
    if (0x7f < local_140) {
      return false;
    }
    name = hostip;
    memcpy(name,__src,local_140);
    cVar5 = '\x02';
    hostip[local_140] = '\0';
  }
  else {
    local_140 = strlen(name);
    iVar6 = inet_pton(2,name,hostip);
    if (iVar6 != 1) {
      local_140 = local_140 - (name[local_140 - 1] == '.');
    }
    cVar5 = iVar6 == 1;
    bVar1 = *no_proxy;
  }
  do {
    sVar13 = 0xffffffffffffffff;
    bVar14 = bVar1 != 0;
    if (!bVar14) {
      return false;
    }
    while ((bVar1 == 9 || (bVar1 == 0x20))) {
      pbVar10 = (byte *)no_proxy + 1;
      no_proxy = (char *)((byte *)no_proxy + 1);
      bVar1 = *pbVar10;
    }
    lVar8 = 0;
    bVar2 = bVar1;
    while ((0x2c < bVar2 || ((0x100100000201U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
      bVar2 = ((byte *)no_proxy)[sVar13 + 2];
      lVar8 = lVar8 + -1;
      sVar13 = sVar13 + 1;
    }
    if (lVar8 != 0) {
      __n = -lVar8;
      if (cVar5 == '\0') {
        if (((byte *)no_proxy)[sVar13] == 0x2e) {
          __n = sVar13;
        }
        pbVar10 = (byte *)no_proxy;
        if (__n == 0) {
          __n = 0;
        }
        else if (bVar1 == 0x2e) {
          __n = __n - 1;
          pbVar10 = (byte *)no_proxy + 1;
        }
        lVar9 = local_140 - __n;
        uVar7 = local_140;
        pcVar4 = name;
        if (lVar9 != 0) {
          if ((local_140 < __n || lVar9 == 0) || (name[lVar9 + -1] != '.')) goto LAB_001449c4;
          uVar7 = __n;
          pcVar4 = name + lVar9;
        }
        iVar6 = curl_strnequal((char *)pbVar10,pcVar4,uVar7);
        if (iVar6 != 0) {
          return bVar14;
        }
      }
      else if (__n < 0x80) {
        memcpy(checkip,no_proxy,__n);
        checkip[sVar13 + 1] = '\0';
        pcVar4 = strchr(checkip,0x2f);
        if (pcVar4 == (char *)0x0) {
          if (cVar5 == '\x02') {
LAB_00144862:
            bVar14 = false;
            uVar3 = 0x80;
            uVar12 = 0x10;
            cVar11 = '\0';
LAB_00144877:
            iVar6 = inet_pton(10,name,address_1);
            if ((((iVar6 == 1) && (iVar6 = inet_pton(10,checkip,local_168), iVar6 == 1)) &&
                ((uVar7 = (ulong)uVar12, uVar3 < 8 ||
                 (iVar6 = bcmp(address_1,local_168,uVar7), iVar6 == 0)))) &&
               ((!bVar14 ||
                ((byte)((*(byte *)((long)local_168 + uVar7) ^ address_1[uVar7]) >>
                       (8U - cVar11 & 0x1f)) != 0)))) {
              return true;
            }
          }
          else {
            uVar3 = 0;
LAB_0014496a:
            address_1[0] = '\0';
            address_1[1] = '\0';
            address_1[2] = '\0';
            address_1[3] = '\0';
            local_168[0] = 0;
            iVar6 = inet_pton(2,name,address_1);
            if ((iVar6 == 1) && (iVar6 = inet_pton(2,checkip,local_168), iVar6 == 1)) {
              if ((uVar3 & 0x1f) == 0) {
                bVar15 = address_1._0_4_ == local_168[0];
              }
              else {
                uVar12 = local_168[0] ^ address_1._0_4_;
                bVar15 = (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                         uVar12 << 0x18) >> (-(char)uVar3 & 0x1fU) == 0;
              }
              if (bVar15) {
                return bVar14;
              }
            }
          }
        }
        else {
          uVar3 = atoi(pcVar4 + 1);
          *pcVar4 = '\0';
          if (cVar5 == '\x02') {
            if (uVar3 == 0) goto LAB_00144862;
            if (uVar3 < 0x88) {
              uVar12 = uVar3 >> 3;
              cVar11 = (char)(uVar3 & 7);
              bVar14 = (uVar3 & 7) != 0;
              if (uVar12 != 0x10 || !bVar14) goto LAB_00144877;
            }
          }
          else {
            address_1[0] = '\0';
            address_1[1] = '\0';
            address_1[2] = '\0';
            address_1[3] = '\0';
            local_168[0] = 0;
            if (uVar3 < 0x21) goto LAB_0014496a;
          }
        }
      }
    }
LAB_001449c4:
    for (no_proxy = (char *)((byte *)no_proxy + -lVar8);
        (bVar1 = *no_proxy, bVar1 == 9 || (bVar1 == 0x20));
        no_proxy = (char *)((byte *)no_proxy + 1)) {
    }
    if (bVar1 != 0x2c) {
      return false;
    }
    while (bVar1 == 0x2c) {
      pbVar10 = (byte *)no_proxy + 1;
      no_proxy = (char *)((byte *)no_proxy + 1);
      bVar1 = *pbVar10;
    }
  } while( true );
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy)
{
  char hostip[128];

  /*
   * If we do not have a hostname at all, like for example with a FILE
   * transfer, we have nothing to interrogate the noproxy list with.
   */
  if(!name || name[0] == '\0')
    return FALSE;

  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it was not just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      namelen = strlen(name);
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      else {
        /* ignore trailing dots in the hostname */
        if(name[namelen - 1] == '.')
          namelen--;
      }
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          /* ignore trailing dots in the token to check */
          if(token[tokenlen - 1] == '.')
            tokenlen--;

          if(tokenlen && (*token == '.')) {
            /* ignore leading token dot as well */
            token++;
            tokenlen--;
          }
          /* A: example.com matches 'example.com'
             B: www.example.com matches 'example.com'
             C: nonexample.com DOES NOT match 'example.com'
          */
          if(tokenlen == namelen)
            /* case A, exact match */
            match = strncasecompare(token, name, namelen);
          else if(tokenlen < namelen) {
            /* case B, tailmatch domain */
            match = (name[namelen - tokenlen - 1] == '.') &&
              strncasecompare(token, name + (namelen - tokenlen),
                              tokenlen);
          }
          /* case C passes through, not a match */
          break;
        case TYPE_IPV4:
        case TYPE_IPV6: {
          const char *check = token;
          char *slash;
          unsigned int bits = 0;
          char checkip[128];
          if(tokenlen >= sizeof(checkip))
            /* this cannot match */
            break;
          /* copy the check name to a temp buffer */
          memcpy(checkip, check, tokenlen);
          checkip[tokenlen] = 0;
          check = checkip;

          slash = strchr(check, '/');
          /* if the slash is part of this token, use it */
          if(slash) {
            /* if the bits variable gets a crazy value here, that is fine as
               the value will then be rejected in the cidr function */
            bits = (unsigned int)atoi(slash + 1);
            *slash = 0; /* null terminate there */
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      /* pass blanks after pattern */
      while(ISBLANK(*p))
        p++;
      /* if not a comma, this ends the loop */
      if(*p != ',')
        break;
      /* pass any number of commas */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it was not just an asterisk */

  return FALSE;
}